

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixLock(sqlite3_file *id,int eFileLock)

{
  int iVar1;
  int *piVar2;
  int local_54;
  undefined1 local_50 [4];
  int tErrno;
  flock lock;
  unixInodeInfo *pInode;
  unixFile *pFile;
  int rc;
  int eFileLock_local;
  sqlite3_file *id_local;
  
  pFile._0_4_ = 0;
  local_54 = 0;
  if (eFileLock <= (int)(uint)*(byte *)((long)&id[3].pMethods + 4)) {
    return 0;
  }
  lock._24_8_ = id[2].pMethods;
  sqlite3_mutex_enter((sqlite3_mutex *)((sqlite3_io_methods *)lock._24_8_)->xRead);
  if ((*(char *)((long)&id[3].pMethods + 4) == *(char *)(lock._24_8_ + 0x20)) ||
     ((*(byte *)(lock._24_8_ + 0x20) < 3 && (eFileLock < 2)))) {
    if ((eFileLock == 1) &&
       ((*(char *)(lock._24_8_ + 0x20) == '\x01' || (*(char *)(lock._24_8_ + 0x20) == '\x02')))) {
      *(undefined1 *)((long)&id[3].pMethods + 4) = 1;
      *(int *)(lock._24_8_ + 0x18) = *(int *)(lock._24_8_ + 0x18) + 1;
      *(int *)(lock._24_8_ + 0x1c) = *(int *)(lock._24_8_ + 0x1c) + 1;
    }
    else {
      lock.l_start = 1;
      local_50._2_2_ = 0;
      if ((eFileLock == 1) || ((eFileLock == 4 && (*(byte *)((long)&id[3].pMethods + 4) < 3)))) {
        local_50._0_2_ = ZEXT12(eFileLock != 1);
        lock._0_8_ = SEXT48(sqlite3PendingByte);
        iVar1 = unixFileLock((unixFile *)id,(flock *)local_50);
        if (iVar1 != 0) {
          piVar2 = __errno_location();
          iVar1 = *piVar2;
          pFile._0_4_ = sqliteErrorFromPosixError(iVar1,0xf0a);
          if ((int)pFile != 5) {
            storeLastErrno((unixFile *)id,iVar1);
          }
          goto LAB_00159e40;
        }
      }
      if (eFileLock == 1) {
        lock._0_8_ = SEXT48(sqlite3PendingByte + 2);
        lock.l_start = 0x1fe;
        iVar1 = unixFileLock((unixFile *)id,(flock *)local_50);
        if (iVar1 != 0) {
          piVar2 = __errno_location();
          local_54 = *piVar2;
          pFile._0_4_ = sqliteErrorFromPosixError(local_54,0xf0a);
        }
        lock._0_8_ = SEXT48(sqlite3PendingByte);
        lock.l_start = 1;
        local_50._0_2_ = 2;
        iVar1 = unixFileLock((unixFile *)id,(flock *)local_50);
        if ((iVar1 != 0) && ((int)pFile == 0)) {
          piVar2 = __errno_location();
          local_54 = *piVar2;
          pFile._0_4_ = 0x80a;
        }
        if ((int)pFile != 0) {
          if ((int)pFile != 5) {
            storeLastErrno((unixFile *)id,local_54);
          }
          goto LAB_00159e40;
        }
        *(undefined1 *)((long)&id[3].pMethods + 4) = 1;
        *(int *)(lock._24_8_ + 0x1c) = *(int *)(lock._24_8_ + 0x1c) + 1;
        *(undefined4 *)(lock._24_8_ + 0x18) = 1;
      }
      else if ((eFileLock == 4) && (1 < *(int *)(lock._24_8_ + 0x18))) {
        pFile._0_4_ = 5;
      }
      else {
        local_50._0_2_ = 1;
        if (eFileLock == 2) {
          iVar1 = sqlite3PendingByte + 1;
          lock.l_start = 1;
        }
        else {
          iVar1 = sqlite3PendingByte + 2;
          lock.l_start = 0x1fe;
        }
        lock._0_8_ = SEXT48(iVar1);
        iVar1 = unixFileLock((unixFile *)id,(flock *)local_50);
        if (iVar1 != 0) {
          piVar2 = __errno_location();
          iVar1 = *piVar2;
          pFile._0_4_ = sqliteErrorFromPosixError(iVar1,0xf0a);
          if ((int)pFile != 5) {
            storeLastErrno((unixFile *)id,iVar1);
          }
        }
      }
      if ((int)pFile == 0) {
        *(char *)((long)&id[3].pMethods + 4) = (char)eFileLock;
        *(char *)(lock._24_8_ + 0x20) = (char)eFileLock;
      }
      else if (eFileLock == 4) {
        *(undefined1 *)((long)&id[3].pMethods + 4) = 3;
        *(undefined1 *)(lock._24_8_ + 0x20) = 3;
      }
    }
  }
  else {
    pFile._0_4_ = 5;
  }
LAB_00159e40:
  sqlite3_mutex_leave(*(sqlite3_mutex **)(lock._24_8_ + 0x10));
  return (int)pFile;
}

Assistant:

static int unixLock(sqlite3_file *id, int eFileLock){
  /* The following describes the implementation of the various locks and
  ** lock transitions in terms of the POSIX advisory shared and exclusive
  ** lock primitives (called read-locks and write-locks below, to avoid
  ** confusion with SQLite lock names). The algorithms are complicated
  ** slightly in order to be compatible with Windows95 systems simultaneously
  ** accessing the same database file, in case that is ever required.
  **
  ** Symbols defined in os.h indentify the 'pending byte' and the 'reserved
  ** byte', each single bytes at well known offsets, and the 'shared byte
  ** range', a range of 510 bytes at a well known offset.
  **
  ** To obtain a SHARED lock, a read-lock is obtained on the 'pending
  ** byte'.  If this is successful, 'shared byte range' is read-locked
  ** and the lock on the 'pending byte' released.  (Legacy note:  When
  ** SQLite was first developed, Windows95 systems were still very common,
  ** and Widnows95 lacks a shared-lock capability.  So on Windows95, a
  ** single randomly selected by from the 'shared byte range' is locked.
  ** Windows95 is now pretty much extinct, but this work-around for the
  ** lack of shared-locks on Windows95 lives on, for backwards
  ** compatibility.)
  **
  ** A process may only obtain a RESERVED lock after it has a SHARED lock.
  ** A RESERVED lock is implemented by grabbing a write-lock on the
  ** 'reserved byte'. 
  **
  ** A process may only obtain a PENDING lock after it has obtained a
  ** SHARED lock. A PENDING lock is implemented by obtaining a write-lock
  ** on the 'pending byte'. This ensures that no new SHARED locks can be
  ** obtained, but existing SHARED locks are allowed to persist. A process
  ** does not have to obtain a RESERVED lock on the way to a PENDING lock.
  ** This property is used by the algorithm for rolling back a journal file
  ** after a crash.
  **
  ** An EXCLUSIVE lock, obtained after a PENDING lock is held, is
  ** implemented by obtaining a write-lock on the entire 'shared byte
  ** range'. Since all other locks require a read-lock on one of the bytes
  ** within this range, this ensures that no other locks are held on the
  ** database. 
  */
  int rc = SQLITE_OK;
  unixFile *pFile = (unixFile*)id;
  unixInodeInfo *pInode;
  struct flock lock;
  int tErrno = 0;

  assert( pFile );
  OSTRACE(("LOCK    %d %s was %s(%s,%d) pid=%d (unix)\n", pFile->h,
      azFileLock(eFileLock), azFileLock(pFile->eFileLock),
      azFileLock(pFile->pInode->eFileLock), pFile->pInode->nShared,
      osGetpid(0)));

  /* If there is already a lock of this type or more restrictive on the
  ** unixFile, do nothing. Don't use the end_lock: exit path, as
  ** unixEnterMutex() hasn't been called yet.
  */
  if( pFile->eFileLock>=eFileLock ){
    OSTRACE(("LOCK    %d %s ok (already held) (unix)\n", pFile->h,
            azFileLock(eFileLock)));
    return SQLITE_OK;
  }

  /* Make sure the locking sequence is correct.
  **  (1) We never move from unlocked to anything higher than shared lock.
  **  (2) SQLite never explicitly requests a pendig lock.
  **  (3) A shared lock is always held when a reserve lock is requested.
  */
  assert( pFile->eFileLock!=NO_LOCK || eFileLock==SHARED_LOCK );
  assert( eFileLock!=PENDING_LOCK );
  assert( eFileLock!=RESERVED_LOCK || pFile->eFileLock==SHARED_LOCK );

  /* This mutex is needed because pFile->pInode is shared across threads
  */
  pInode = pFile->pInode;
  sqlite3_mutex_enter(pInode->pLockMutex);

  /* If some thread using this PID has a lock via a different unixFile*
  ** handle that precludes the requested lock, return BUSY.
  */
  if( (pFile->eFileLock!=pInode->eFileLock && 
          (pInode->eFileLock>=PENDING_LOCK || eFileLock>SHARED_LOCK))
  ){
    rc = SQLITE_BUSY;
    goto end_lock;
  }

  /* If a SHARED lock is requested, and some thread using this PID already
  ** has a SHARED or RESERVED lock, then increment reference counts and
  ** return SQLITE_OK.
  */
  if( eFileLock==SHARED_LOCK && 
      (pInode->eFileLock==SHARED_LOCK || pInode->eFileLock==RESERVED_LOCK) ){
    assert( eFileLock==SHARED_LOCK );
    assert( pFile->eFileLock==0 );
    assert( pInode->nShared>0 );
    pFile->eFileLock = SHARED_LOCK;
    pInode->nShared++;
    pInode->nLock++;
    goto end_lock;
  }


  /* A PENDING lock is needed before acquiring a SHARED lock and before
  ** acquiring an EXCLUSIVE lock.  For the SHARED lock, the PENDING will
  ** be released.
  */
  lock.l_len = 1L;
  lock.l_whence = SEEK_SET;
  if( eFileLock==SHARED_LOCK 
      || (eFileLock==EXCLUSIVE_LOCK && pFile->eFileLock<PENDING_LOCK)
  ){
    lock.l_type = (eFileLock==SHARED_LOCK?F_RDLCK:F_WRLCK);
    lock.l_start = PENDING_BYTE;
    if( unixFileLock(pFile, &lock) ){
      tErrno = errno;
      rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_LOCK);
      if( rc!=SQLITE_BUSY ){
        storeLastErrno(pFile, tErrno);
      }
      goto end_lock;
    }
  }


  /* If control gets to this point, then actually go ahead and make
  ** operating system calls for the specified lock.
  */
  if( eFileLock==SHARED_LOCK ){
    assert( pInode->nShared==0 );
    assert( pInode->eFileLock==0 );
    assert( rc==SQLITE_OK );

    /* Now get the read-lock */
    lock.l_start = SHARED_FIRST;
    lock.l_len = SHARED_SIZE;
    if( unixFileLock(pFile, &lock) ){
      tErrno = errno;
      rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_LOCK);
    }

    /* Drop the temporary PENDING lock */
    lock.l_start = PENDING_BYTE;
    lock.l_len = 1L;
    lock.l_type = F_UNLCK;
    if( unixFileLock(pFile, &lock) && rc==SQLITE_OK ){
      /* This could happen with a network mount */
      tErrno = errno;
      rc = SQLITE_IOERR_UNLOCK; 
    }

    if( rc ){
      if( rc!=SQLITE_BUSY ){
        storeLastErrno(pFile, tErrno);
      }
      goto end_lock;
    }else{
      pFile->eFileLock = SHARED_LOCK;
      pInode->nLock++;
      pInode->nShared = 1;
    }
  }else if( eFileLock==EXCLUSIVE_LOCK && pInode->nShared>1 ){
    /* We are trying for an exclusive lock but another thread in this
    ** same process is still holding a shared lock. */
    rc = SQLITE_BUSY;
  }else{
    /* The request was for a RESERVED or EXCLUSIVE lock.  It is
    ** assumed that there is a SHARED or greater lock on the file
    ** already.
    */
    assert( 0!=pFile->eFileLock );
    lock.l_type = F_WRLCK;

    assert( eFileLock==RESERVED_LOCK || eFileLock==EXCLUSIVE_LOCK );
    if( eFileLock==RESERVED_LOCK ){
      lock.l_start = RESERVED_BYTE;
      lock.l_len = 1L;
    }else{
      lock.l_start = SHARED_FIRST;
      lock.l_len = SHARED_SIZE;
    }

    if( unixFileLock(pFile, &lock) ){
      tErrno = errno;
      rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_LOCK);
      if( rc!=SQLITE_BUSY ){
        storeLastErrno(pFile, tErrno);
      }
    }
  }
  

#ifdef SQLITE_DEBUG
  /* Set up the transaction-counter change checking flags when
  ** transitioning from a SHARED to a RESERVED lock.  The change
  ** from SHARED to RESERVED marks the beginning of a normal
  ** write operation (not a hot journal rollback).
  */
  if( rc==SQLITE_OK
   && pFile->eFileLock<=SHARED_LOCK
   && eFileLock==RESERVED_LOCK
  ){
    pFile->transCntrChng = 0;
    pFile->dbUpdate = 0;
    pFile->inNormalWrite = 1;
  }
#endif


  if( rc==SQLITE_OK ){
    pFile->eFileLock = eFileLock;
    pInode->eFileLock = eFileLock;
  }else if( eFileLock==EXCLUSIVE_LOCK ){
    pFile->eFileLock = PENDING_LOCK;
    pInode->eFileLock = PENDING_LOCK;
  }

end_lock:
  sqlite3_mutex_leave(pInode->pLockMutex);
  OSTRACE(("LOCK    %d %s %s (unix)\n", pFile->h, azFileLock(eFileLock), 
      rc==SQLITE_OK ? "ok" : "failed"));
  return rc;
}